

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O3

void __thiscall Num3072::Divide(Num3072 *this,Num3072 *a)

{
  limb_t *plVar1;
  ulong uVar2;
  int i;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  Num3072 b;
  Num3072 local_318;
  Num3072 local_198;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (0xffffffffffef289a < this->limbs[0]) {
    lVar3 = 1;
    do {
      if (this->limbs[lVar3] != 0xffffffffffffffff) goto LAB_0079449b;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x30);
    uVar4 = 0x10d765;
    lVar3 = 0;
    do {
      plVar1 = this->limbs + lVar3;
      uVar2 = *plVar1;
      *plVar1 = *plVar1 + uVar4;
      uVar4 = (ulong)CARRY8(uVar2,uVar4);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x30);
  }
LAB_0079449b:
  local_198.limbs[0] = 1;
  memset(local_198.limbs + 1,0,0x178);
  if (0xffffffffffef289a < a->limbs[0]) {
    lVar3 = 1;
    do {
      if (a->limbs[lVar3] != 0xffffffffffffffff) goto LAB_00794519;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x30);
    memcpy(&local_318,a,0x180);
    uVar4 = 0x10d765;
    lVar3 = 0;
    do {
      plVar1 = local_318.limbs + lVar3;
      uVar2 = *plVar1;
      *plVar1 = *plVar1 + uVar4;
      uVar4 = (ulong)CARRY8(uVar2,uVar4);
      lVar3 = lVar3 + 1;
      a = &local_318;
    } while (lVar3 != 0x30);
  }
LAB_00794519:
  GetInverse(&local_198,a);
  Multiply(this,&local_198);
  if (0xffffffffffef289a < this->limbs[0]) {
    lVar3 = 1;
    do {
      if (this->limbs[lVar3] != 0xffffffffffffffff) goto LAB_00794568;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x30);
    uVar4 = 0x10d765;
    lVar3 = 0;
    do {
      plVar1 = this->limbs + lVar3;
      uVar2 = *plVar1;
      *plVar1 = *plVar1 + uVar4;
      uVar4 = (ulong)CARRY8(uVar2,uVar4);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x30);
  }
LAB_00794568:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Num3072::Divide(const Num3072& a)
{
    if (this->IsOverflow()) this->FullReduce();

    Num3072 inv{};
    if (a.IsOverflow()) {
        Num3072 b = a;
        b.FullReduce();
        inv = b.GetInverse();
    } else {
        inv = a.GetInverse();
    }

    this->Multiply(inv);
    if (this->IsOverflow()) this->FullReduce();
}